

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

int fy_node_hash_internal(fy_node *fyn,fy_hash_update_fn update_fn,void *state)

{
  fy_node_pair *pfVar1;
  fy_node *pfVar2;
  long lVar3;
  uint uVar4;
  XXH_errorcode XVar5;
  XXH_errorcode extraout_EAX;
  fy_iter_chunk *curr;
  fy_token *pfVar6;
  void *extraout_RDX;
  void *state_00;
  void *extraout_RDX_00;
  void *state_01;
  void *state_02;
  char *input;
  anon_union_16_3_aa7ec5a3_for_fy_node_12 *paVar7;
  ulong uVar8;
  fy_node_pair **fynpp;
  fy_node_pair *apfStack_250 [2];
  undefined1 local_240 [8];
  fy_token_iter iter;
  
  if (fyn == (fy_node *)0x0) {
    XVar5 = XXH32_update((XXH32_state_t *)update_fn,"s",1);
    return XVar5;
  }
  uVar4 = (byte)fyn->field_0x34 & 3;
  XVar5 = (&switchD_001246cd::switchdataD_001450a0)[uVar4] + 0x1450a0;
  switch(uVar4) {
  case 0:
    input = "s";
    if (fyn->style == FYNS_ALIAS) {
      input = "A";
    }
    apfStack_250[0] = (fy_node_pair *)0x1246f3;
    XXH32_update((XXH32_state_t *)update_fn,input,1);
    apfStack_250[0] = (fy_node_pair *)0x124706;
    fy_token_iter_start((fyn->field_12).scalar,(fy_token_iter *)local_240);
    apfStack_250[0] = (fy_node_pair *)0x124714;
    curr = fy_token_iter_chunk_next
                     ((fy_token_iter *)local_240,(fy_iter_chunk *)0x0,(int *)&iter.field_0x204);
    if (curr != (fy_iter_chunk *)0x0) {
      do {
        apfStack_250[0] = (fy_node_pair *)0x124736;
        XXH32_update((XXH32_state_t *)update_fn,curr->str,curr->len);
        apfStack_250[0] = (fy_node_pair *)0x124744;
        curr = fy_token_iter_chunk_next((fy_token_iter *)local_240,curr,(int *)&iter.field_0x204);
      } while (curr != (fy_iter_chunk *)0x0);
    }
    apfStack_250[0] = (fy_node_pair *)0x124758;
    fy_token_iter_finish((fy_token_iter *)local_240);
    XVar5 = extraout_EAX;
    break;
  case 1:
    apfStack_250[0] = (fy_node_pair *)0x124793;
    XVar5 = XXH32_update((XXH32_state_t *)update_fn,"S",1);
    pfVar6 = (fyn->field_12).scalar;
    paVar7 = &fyn->field_12;
    XVar5 = CONCAT31((int3)(XVar5 >> 8),pfVar6 == (fy_token *)paVar7);
    state_00 = extraout_RDX;
    if (pfVar6 != (fy_token *)0x0 && pfVar6 != (fy_token *)paVar7) {
      do {
        apfStack_250[0] = (fy_node_pair *)0x1247ba;
        XVar5 = fy_node_hash_internal((fy_node *)pfVar6,update_fn,state_00);
        pfVar6 = (fy_token *)(pfVar6->node).next;
        if (pfVar6 == (fy_token *)paVar7) {
          return XVar5;
        }
        state_00 = extraout_RDX_00;
      } while (pfVar6 != (fy_token *)0x0);
    }
    break;
  case 2:
    pfVar6 = (fyn->field_12).scalar;
    uVar4 = 0;
    if (pfVar6 != (fy_token *)0x0 && pfVar6 != (fy_token *)&fyn->field_12) {
      uVar4 = 0;
      do {
        uVar4 = uVar4 + 1;
        pfVar6 = (fy_token *)(pfVar6->node).next;
        if (pfVar6 == (fy_token *)&fyn->field_12) break;
      } while (pfVar6 != (fy_token *)0x0);
    }
    lVar3 = -((long)(int)uVar4 * 8 + 0x17U & 0xfffffffffffffff0);
    fynpp = (fy_node_pair **)((long)apfStack_250 + lVar3 + 8);
    *(undefined8 *)((long)apfStack_250 + lVar3) = 0x12482a;
    fy_node_mapping_perform_sort(fyn,(fy_node_mapping_sort_fn)0x0,(void *)0x0,fynpp,uVar4);
    *(undefined8 *)((long)apfStack_250 + lVar3) = 0x12483e;
    XVar5 = XXH32_update((XXH32_state_t *)update_fn,"M",1);
    if (0 < (int)uVar4) {
      uVar8 = 0;
      do {
        pfVar1 = fynpp[uVar8];
        *(undefined8 *)((long)apfStack_250 + lVar3) = 0x124861;
        XXH32_update((XXH32_state_t *)update_fn,"K",1);
        pfVar2 = pfVar1->key;
        *(undefined8 *)((long)apfStack_250 + lVar3) = 0x12486e;
        fy_node_hash_internal(pfVar2,update_fn,state_01);
        *(undefined8 *)((long)apfStack_250 + lVar3) = 0x124882;
        XXH32_update((XXH32_state_t *)update_fn,"V",1);
        pfVar2 = pfVar1->value;
        *(undefined8 *)((long)apfStack_250 + lVar3) = 0x12488f;
        XVar5 = fy_node_hash_internal(pfVar2,update_fn,state_02);
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
    }
  }
  return XVar5;
}

Assistant:

static int
fy_node_hash_internal(struct fy_node *fyn, fy_hash_update_fn update_fn, void *state) {
    struct fy_node *fyni;
    struct fy_node_pair *fynp;
    struct fy_node_pair **fynpp;
    struct fy_token_iter iter;
    int i, count, rc;
    const struct fy_iter_chunk *ic;

    if (!fyn) {
        /* NULL */
        update_fn(state, "s", 1);    /* as zero length scalar */
        return 0;
    }

    switch (fyn->type) {
        case FYNT_SEQUENCE:
            /* SEQUENCE */
            update_fn(state, "S", 1);

            for (fyni = fy_node_list_head(&fyn->sequence); fyni;
                 fyni = fy_node_next(&fyn->sequence, fyni)) {

                rc = fy_node_hash_internal(fyni, update_fn, state);
                if (rc)
                    return rc;
            }

            break;

        case FYNT_MAPPING:
            count = fy_node_mapping_item_count(fyn);

            fynpp = alloca(sizeof(*fynpp) * (count + 1));
            fy_node_mapping_perform_sort(fyn, NULL, NULL, fynpp, count);

            /* MAPPING */
            update_fn(state, "M", 1);

            for (i = 0; i < count; i++) {
                fynp = fynpp[i];

                /* MAPPING KEY */
                update_fn(state, "K", 1);
                rc = fy_node_hash_internal(fynp->key, update_fn, state);
                if (rc)
                    return rc;

                /* MAPPING VALUE */
                update_fn(state, "V", 1);
                rc = fy_node_hash_internal(fynp->value, update_fn, state);
                if (rc)
                    return rc;
            }

            break;

        case FYNT_SCALAR:
            update_fn(state, !fy_node_is_alias(fyn) ? "s" : "A", 1);

            fy_token_iter_start(fyn->scalar, &iter);
            ic = NULL;
            while ((ic = fy_token_iter_chunk_next(&iter, ic, &rc)) != NULL)
                update_fn(state, ic->str, ic->len);
            fy_token_iter_finish(&iter);

            break;
    }

    return 0;
}